

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> * __thiscall
kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
await_resume(OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>
             *__return_storage_ptr__,
            PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
            *this)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  anon_union_64_1_a8c68091_for_NullableValue<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>_2
  *paVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  void *unaff_retaddr;
  
  PromiseAwaiterBase::awaitResumeImpl
            (&this->super_PromiseAwaiterBase,&(this->result).super_ExceptionOrValue,unaff_retaddr);
  paVar5 = (anon_union_64_1_a8c68091_for_NullableValue<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>_2
            *)0x0;
  if ((this->result).value.ptr.isSet != false) {
    paVar5 = &(this->result).value.ptr.field_1;
  }
  uVar1 = (paVar5->value).tag;
  __return_storage_ptr__->tag = uVar1;
  if (uVar1 == 2) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         *(undefined8 *)((long)paVar5 + 0x38);
    uVar6 = *(undefined4 *)((long)paVar5 + 8);
    uVar7 = *(undefined4 *)((long)paVar5 + 0xc);
    uVar8 = *(undefined4 *)((long)paVar5 + 0x10);
    uVar9 = *(undefined4 *)((long)paVar5 + 0x14);
    uVar2 = *(undefined8 *)((long)paVar5 + 0x18);
    uVar3 = *(undefined8 *)((long)paVar5 + 0x20);
    uVar4 = *(undefined8 *)((long)paVar5 + 0x30);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) =
         *(undefined8 *)((long)paVar5 + 0x28);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = uVar4;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = uVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = uVar3;
  }
  else {
    if (uVar1 != 1) {
      return __return_storage_ptr__;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
         *(undefined8 *)((long)paVar5 + 0x18);
    uVar6 = *(undefined4 *)((long)paVar5 + 8);
    uVar7 = *(undefined4 *)((long)paVar5 + 0xc);
    uVar8 = *(undefined4 *)((long)paVar5 + 0x10);
    uVar9 = *(undefined4 *)((long)paVar5 + 0x14);
  }
  *(undefined4 *)&__return_storage_ptr__->field_1 = uVar6;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = uVar7;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = uVar9;
  return __return_storage_ptr__;
}

Assistant:

KJ_NOINLINE T await_resume() {
    // This is marked noinline in order to ensure __builtin_return_address() is accurate for stack
    // trace purposes. In my experimentation, this method was not inlined anyway even in opt
    // builds, but I want to make sure it doesn't suddenly start being inlined later causing stack
    // traces to break. (I also tried always-inline, but this did not appear to cause the compiler
    // to inline the method -- perhaps a limitation of coroutines?)
#if __GNUC__
    awaitResumeImpl(result, __builtin_return_address(0));
#elif _MSC_VER
    awaitResumeImpl(result, _ReturnAddress());
#else
    #error "please implement for your compiler"
#endif
    auto value = kj::_::readMaybe(result.value);
    KJ_IASSERT(value != nullptr, "Neither exception nor value present.");
    return T(kj::mv(*value));
  }